

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacAlgorithm.cpp
# Opt level: O1

bool __thiscall MacAlgorithm::signInit(MacAlgorithm *this,SymmetricKey *key)

{
  if ((key != (SymmetricKey *)0x0) && (this->currentOperation == NONE)) {
    this->currentKey = key;
    this->currentOperation = SIGN;
    return true;
  }
  return false;
}

Assistant:

bool MacAlgorithm::signInit(const SymmetricKey* key)
{
	if ((key == NULL) || (currentOperation != NONE))
	{
		return false;
	}

	currentKey = key;
	currentOperation = SIGN;

	return true;
}